

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::array_literal_expression::print(array_literal_expression *this,wostream *os)

{
  expression *peVar1;
  pointer puVar2;
  pointer puVar3;
  ulong uVar4;
  
  std::operator<<(os,"array_literal_expression{");
  puVar2 = (this->elements_).
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->elements_).
      super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    uVar4 = 0;
    do {
      puVar3 = puVar2;
      if (uVar4 != 0) {
        std::operator<<(os,", ");
        puVar2 = (this->elements_).
                 super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        puVar3 = puVar2 + uVar4;
      }
      if ((puVar3->_M_t).
          super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
          super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
          super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
        peVar1 = puVar2[uVar4]._M_t.
                 super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
                 super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
                 super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
        (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,os);
        puVar2 = (this->elements_).
                 super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)(this->elements_).
                                   super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "array_literal_expression{";
        for (size_t i = 0; i < elements_.size(); ++i) {
            if (i) os << ", ";
            if (elements_[i]) os << *elements_[i];
        }
        os << "}";
    }